

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O2

int ar_parse_common_header(ar *ar,archive_entry *entry,char *h)

{
  int extraout_EAX;
  uint64_t uVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  uVar1 = ar_atol10(h + 0x10,0xc);
  archive_entry_set_mtime(entry,uVar1,0);
  uVar1 = ar_atol10(h + 0x1c,6);
  archive_entry_set_uid(entry,uVar1 & 0xffffffff);
  uVar1 = ar_atol10(h + 0x22,6);
  archive_entry_set_gid(entry,uVar1 & 0xffffffff);
  pcVar2 = h + 0x28;
  iVar3 = 8;
  while( true ) {
    if ((*pcVar2 != '\t') && (*pcVar2 != ' ')) goto LAB_0011fad2;
    bVar8 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar8) break;
    pcVar2 = pcVar2 + 1;
  }
  iVar3 = -1;
  pcVar2 = h + 0x30;
LAB_0011fad2:
  lVar4 = 0;
  for (uVar5 = 0;
      (((uVar6 = uVar5, 0x2f < pcVar2[lVar4] && (uVar7 = (int)pcVar2[lVar4] - 0x30, uVar7 < 8)) &&
       (iVar3 != (int)lVar4)) && (uVar6 = 0xffffffffffffffff, uVar5 >> 0x3d == 0));
      uVar5 = (ulong)uVar7 + uVar5 * 8) {
    lVar4 = lVar4 + 1;
  }
  archive_entry_set_mode(entry,(mode_t)uVar6);
  uVar1 = ar_atol10(h + 0x30,10);
  ar->entry_offset = 0;
  ar->entry_padding = (ulong)((uint)uVar1 & 1);
  archive_entry_set_size(entry,uVar1);
  ar->entry_bytes_remaining = uVar1;
  return extraout_EAX;
}

Assistant:

static int
ar_parse_common_header(struct ar *ar, struct archive_entry *entry,
    const char *h)
{
	uint64_t n;

	/* Copy remaining header */
	archive_entry_set_mtime(entry,
	    (time_t)ar_atol10(h + AR_date_offset, AR_date_size), 0L);
	archive_entry_set_uid(entry,
	    (uid_t)ar_atol10(h + AR_uid_offset, AR_uid_size));
	archive_entry_set_gid(entry,
	    (gid_t)ar_atol10(h + AR_gid_offset, AR_gid_size));
	archive_entry_set_mode(entry,
	    (mode_t)ar_atol8(h + AR_mode_offset, AR_mode_size));
	n = ar_atol10(h + AR_size_offset, AR_size_size);

	ar->entry_offset = 0;
	ar->entry_padding = n % 2;
	archive_entry_set_size(entry, n);
	ar->entry_bytes_remaining = n;
	return (ARCHIVE_OK);
}